

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-try-send.c
# Opt level: O2

int run_test_udp_try_send(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_30;
  sockaddr_in addr;
  uv_buf_t local_18;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_udp_init(puVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_udp_bind(&server,(sockaddr *)&addr,0);
      if (iVar1 == 0) {
        iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
        if (iVar1 == 0) {
          iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
          if (iVar1 == 0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_udp_init(puVar2,&client);
            if (iVar1 == 0) {
              local_18 = uv_buf_init(run_test_udp_try_send::buffer,0x10000);
              iVar1 = uv_udp_try_send(&client,&local_18,1,(sockaddr *)&addr);
              if (iVar1 == -0x5a) {
                local_18 = uv_buf_init("EXIT",4);
                iVar1 = uv_udp_try_send(&client,&local_18,1,(sockaddr *)&addr);
                if (iVar1 == 4) {
                  puVar2 = uv_default_loop();
                  uv_run(puVar2,UV_RUN_DEFAULT);
                  if (close_cb_called == 2) {
                    if (sv_recv_cb_called == 1) {
                      if (client.send_queue_size == 0) {
                        if (server.send_queue_size == 0) {
                          puVar2 = uv_default_loop();
                          uv_walk(puVar2,close_walk_cb,(void *)0x0);
                          uv_run(puVar2,UV_RUN_DEFAULT);
                          puVar2 = uv_default_loop();
                          iVar1 = uv_loop_close(puVar2);
                          if (iVar1 == 0) {
                            uv_library_shutdown();
                            return 0;
                          }
                          pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                          uStack_30 = 0x77;
                        }
                        else {
                          pcVar3 = "server.send_queue_size == 0";
                          uStack_30 = 0x75;
                        }
                      }
                      else {
                        pcVar3 = "client.send_queue_size == 0";
                        uStack_30 = 0x74;
                      }
                    }
                    else {
                      pcVar3 = "sv_recv_cb_called == 1";
                      uStack_30 = 0x72;
                    }
                  }
                  else {
                    pcVar3 = "close_cb_called == 2";
                    uStack_30 = 0x71;
                  }
                }
                else {
                  pcVar3 = "r == 4";
                  uStack_30 = 0x6d;
                }
              }
              else {
                pcVar3 = "r == UV_EMSGSIZE";
                uStack_30 = 0x69;
              }
            }
            else {
              pcVar3 = "r == 0";
              uStack_30 = 0x65;
            }
          }
          else {
            pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
            uStack_30 = 0x62;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_30 = 0x60;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_30 = 0x5d;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_30 = 0x5a;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
    uStack_30 = 0x57;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-try-send.c"
          ,uStack_30,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(udp_try_send) {
  struct sockaddr_in addr;
  static char buffer[64 * 1024];
  uv_buf_t buf;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init(buffer, sizeof(buffer));
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &addr);
  ASSERT(r == UV_EMSGSIZE);

  buf = uv_buf_init("EXIT", 4);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &addr);
  ASSERT(r == 4);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);
  ASSERT(sv_recv_cb_called == 1);

  ASSERT(client.send_queue_size == 0);
  ASSERT(server.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}